

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O0

void __thiscall
betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::finished
          (betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          bool with_cell_counts)

{
  undefined4 uVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  ostream *poVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  size_type sVar6;
  byte in_SIL;
  long in_RDI;
  size_t idx_1;
  size_t idx;
  unsigned_long i_1;
  unsigned_long i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> number_of_cells;
  value_type_conflict3 *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  size_type sVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffef0;
  size_type local_c8;
  size_type local_b8;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ostream *in_stack_ffffffffffffffa0;
  ostream *poVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  ulong local_48;
  size_t local_30 [4];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1e5988);
  local_30[0] = directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
                          ((directed_flag_complex_computer_t *)0x1e599c);
  puVar2 = std::max<unsigned_long>(&total_top_dimension,local_30);
  total_top_dimension = *puVar2;
  if ((local_9 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    for (local_48 = 0;
        sVar3 = directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
                          ((directed_flag_complex_computer_t *)0x1e5a12), local_48 <= sVar3;
        local_48 = local_48 + 1) {
      in_stack_ffffffffffffffb0 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           directed_flag_complex_computer::directed_flag_complex_computer_t::number_of_cells
                     ((directed_flag_complex_computer_t *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
    }
    directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
              ((directed_flag_complex_computer_t *)0x1e5abf);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(value_type_conflict3 *)in_stack_fffffffffffffec0);
    poVar8 = (ostream *)0x0;
    while (in_stack_ffffffffffffffa0 = poVar8,
          poVar4 = (ostream *)
                   directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
                             ((directed_flag_complex_computer_t *)0x1e5b1d), poVar8 <= poVar4) {
      in_stack_fffffffffffffef0 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           directed_flag_complex_computer::directed_flag_complex_computer_t::number_of_cells
                     ((directed_flag_complex_computer_t *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&total_cell_count,(size_type)in_stack_ffffffffffffffa0);
      *pvVar5 = (long)&(in_stack_fffffffffffffef0->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + *pvVar5;
      poVar8 = in_stack_ffffffffffffffa0 + 1;
    }
  }
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        directed_flag_complex_computer::directed_flag_complex_computer_t::top_dimension
                  ((directed_flag_complex_computer_t *)0x1e5bd9);
  uVar1 = SUB84(__x,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_fffffffffffffef0,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_fffffffffffffef0,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_fffffffffffffef0,__x);
  print_ordinary(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffff7f,
                 (bool)in_stack_ffffffffffffff7e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffeb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffeb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffeb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(uVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8,
             (value_type_conflict3 *)in_stack_fffffffffffffec0);
  local_b8 = 0;
  while (sVar7 = local_b8,
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218)
                          ), sVar7 < sVar6) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218),
                        local_b8);
    in_stack_fffffffffffffec0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&total_betti,local_b8);
    *pvVar5 = (long)&(in_stack_fffffffffffffec0->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + *pvVar5;
    local_b8 = local_b8 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(uVar1,in_stack_fffffffffffffed0),sVar7,
             (value_type_conflict3 *)in_stack_fffffffffffffec0);
  local_c8 = 0;
  while (sVar7 = local_c8,
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230)
                          ), sVar7 < sVar6) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230),
                        local_c8);
    in_stack_fffffffffffffeb0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&total_skipped,local_c8);
    *pvVar5 = (long)&(in_stack_fffffffffffffeb0->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + *pvVar5;
    local_c8 = local_c8 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void betti_output_t<Complex>::finished(bool with_cell_counts) {
	std::vector<size_t> number_of_cells;
	total_top_dimension = std::max(total_top_dimension, complex->top_dimension());

	if (with_cell_counts) {
		for (auto i = 0ul; i <= complex->top_dimension(); i++) number_of_cells.push_back(complex->number_of_cells(i));

		total_cell_count.resize(complex->top_dimension() + 1, 0);
		for (auto i = 0ul; i <= complex->top_dimension(); i++) total_cell_count[i] += complex->number_of_cells(i);
	} else {
		total_cell_count.resize(0);
	}

	print_ordinary(file_output_t<Complex>::outstream, int(min_dimension), int(max_dimension),
	               int(complex->top_dimension()), number_of_cells, betti, skipped, approximate_computation,
	               with_cell_counts);

	total_betti.resize(betti.size(), 0);
	for (size_t idx = 0; idx < betti.size(); idx++) total_betti[idx] += betti[idx];

	total_skipped.resize(skipped.size(), 0);
	for (size_t idx = 0; idx < skipped.size(); idx++) total_skipped[idx] += skipped[idx];
}